

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incppect.cpp
# Opt level: O0

void __thiscall Incppect<false>::Impl::run(Impl *this)

{
  us_socket_context_options_t options;
  bool bVar1;
  Loop *pLVar2;
  undefined8 uVar3;
  TemplatedApp<false> *pTVar4;
  pointer this_00;
  string *pattern;
  type this_01;
  int *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *resource;
  iterator __end0;
  iterator __begin0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_> app;
  WebSocketBehavior wsBehaviour;
  char *kProtocol;
  pointer __p;
  unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>
  *in_stack_fffffffffffffc90;
  WebSocketBehavior *this_02;
  void *in_stack_fffffffffffffca0;
  unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_> *this_03;
  anon_class_1_0_00000001_for_value_ *in_stack_fffffffffffffcb8;
  allocator<char> *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  int __fd;
  WebSocketBehavior *in_stack_fffffffffffffcd0;
  char *in_stack_fffffffffffffcd8;
  allocator<char> *handler;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 uVar5;
  undefined8 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd48 [24];
  allocator<char> local_261;
  string local_260 [80];
  string local_210 [32];
  reference local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  int *local_1d8;
  allocator<char> local_1a1;
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [16];
  WebSocketBehavior *in_stack_fffffffffffffe98;
  string *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  TemplatedApp<false> local_120;
  undefined4 local_e8;
  int local_e4;
  int local_e0;
  char *local_10;
  
  uVar5 = 0;
  pLVar2 = uWS::Loop::get(in_stack_fffffffffffffca0);
  *(Loop **)(in_RDI + 0x3a) = pLVar2;
  local_10 = "HTTP";
  uVar3 = std::__cxx11::string::c_str();
  printf("[incppect] running instance. serving %s from \'%s\'\n","HTTP",uVar3);
  uWS::TemplatedApp<false>::WebSocketBehavior::WebSocketBehavior(in_stack_fffffffffffffcd0);
  local_e8 = 1;
  local_e4 = in_RDI[1];
  local_e0 = in_RDI[4];
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_uWS::HttpRequest_*)>_>
  ::
  operator=<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:88:28),_nullptr,_nullptr,_nullptr,_nullptr>
            ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_uWS::HttpRequest_*)>_>
              *)in_stack_fffffffffffffcc0,
             (anon_class_8_1_8991fb9c_for_value_ *)in_stack_fffffffffffffcb8);
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
  ::
  operator=<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:114:31),_nullptr,_nullptr,_nullptr,_nullptr>
            ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
              *)in_stack_fffffffffffffcc0,
             (anon_class_8_1_8991fb9c_for_value_ *)in_stack_fffffffffffffcb8);
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
  ::
  operator=<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:207:29),_nullptr,_nullptr,_nullptr,_nullptr>
            ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
              *)in_stack_fffffffffffffcc0,
             (anon_class_1_0_00000001_for_value_ *)in_stack_fffffffffffffcb8);
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
  ::
  operator=<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:213:28),_nullptr,_nullptr,_nullptr,_nullptr>
            ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
              *)in_stack_fffffffffffffcc0,
             (anon_class_1_0_00000001_for_value_ *)in_stack_fffffffffffffcb8);
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
  ::
  operator=<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:216:28),_nullptr,_nullptr,_nullptr,_nullptr>
            ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
              *)in_stack_fffffffffffffcc0,
             (anon_class_1_0_00000001_for_value_ *)in_stack_fffffffffffffcb8);
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  operator=<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:219:29),_nullptr,_nullptr,_nullptr,_nullptr>
            ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
              *)in_stack_fffffffffffffcc0,
             (anon_class_8_1_8991fb9c_for_value_ *)in_stack_fffffffffffffcb8);
  std::unique_ptr<uWS::TemplatedApp<false>,std::default_delete<uWS::TemplatedApp<false>>>::
  unique_ptr<std::default_delete<uWS::TemplatedApp<false>>,void>(in_stack_fffffffffffffc90);
  pTVar4 = (TemplatedApp<false> *)operator_new(0x20);
  this_03 = (unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_> *
            )0x0;
  __p = (pointer)0x0;
  this_02 = (WebSocketBehavior *)0x0;
  options.key_file_name._4_4_ = uVar5;
  options.key_file_name._0_4_ = in_stack_fffffffffffffd30;
  options.cert_file_name = (char *)in_RDI;
  options.passphrase = (char *)in_stack_fffffffffffffd40;
  options.dh_params_file_name = (char *)in_stack_fffffffffffffd48._0_8_;
  options.ca_file_name = (char *)in_stack_fffffffffffffd48._8_8_;
  options.ssl_prefer_low_memory_usage = in_stack_fffffffffffffd48._16_4_;
  options._44_4_ = in_stack_fffffffffffffd48._20_4_;
  uWS::TemplatedApp<false>::TemplatedApp(pTVar4,options);
  pTVar4 = &local_120;
  std::unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>::reset
            ((unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>
              *)this_02,__p);
  this_00 = std::
            unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>::
            operator->((unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>
                        *)0x213b31);
  bVar1 = uWS::TemplatedApp<false>::constructorFailed(this_00);
  if (bVar1) {
    printf("[incppect] failed to construct uWS server!\n");
  }
  else {
    pattern = (string *)
              std::
              unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>
              ::operator*((unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>
                           *)this_02);
    handler = &local_179;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcd0,
               (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
               in_stack_fffffffffffffcc0);
    uWS::TemplatedApp<false>::ws<Incppect<false>::Impl::PerSocketData>
              ((TemplatedApp<false> *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcd0,
               (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
               in_stack_fffffffffffffcc0);
    fu2::abi_400::detail::
    function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
    ::
    function<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:256:31),_nullptr,_nullptr,_nullptr,_nullptr>
              ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
                *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    uWS::TemplatedApp<false>::get
              (pTVar4,pattern,
               (unique_function<void_(HttpResponse<false>_*,_HttpRequest_*)> *)handler);
    fu2::abi_400::detail::
    function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
    ::~function((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
                 *)0x213ca1);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator(&local_179);
    local_1d8 = in_RDI + 0xe;
    local_1e0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)__p);
    local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)__p);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)this_02,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)__p);
      if (!bVar1) break;
      local_1f0 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_1e0);
      std::unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>::
      operator*((unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>
                 *)this_02);
      std::operator+(in_stack_fffffffffffffcd8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcd0);
      fu2::abi_400::detail::
      function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
      ::
      function<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:260:40),_nullptr,_nullptr,_nullptr,_nullptr>
                ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
                  *)in_stack_fffffffffffffcc0,
                 (anon_class_8_1_8991fb9c_for_value_ *)in_stack_fffffffffffffcb8);
      uWS::TemplatedApp<false>::get
                (pTVar4,pattern,
                 (unique_function<void_(HttpResponse<false>_*,_HttpRequest_*)> *)handler);
      fu2::abi_400::detail::
      function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
      ::~function((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
                   *)0x213dc8);
      std::__cxx11::string::~string(local_210);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1e0);
    }
    std::unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>::
    operator*((unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>
               *)this_02);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcd0,
               (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
               in_stack_fffffffffffffcc0);
    fu2::abi_400::detail::
    function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
    ::
    function<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:301:26),_nullptr,_nullptr,_nullptr,_nullptr>
              ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
                *)in_stack_fffffffffffffcc0,
               (anon_class_8_1_8991fb9c_for_value_ *)in_stack_fffffffffffffcb8);
    uWS::TemplatedApp<false>::get
              (pTVar4,pattern,
               (unique_function<void_(HttpResponse<false>_*,_HttpRequest_*)> *)handler);
    fu2::abi_400::detail::
    function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
    ::~function((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
                 *)0x213f76);
    std::__cxx11::string::~string(local_260);
    std::allocator<char>::~allocator(&local_261);
    this_01 = std::
              unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>
              ::operator*((unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>
                           *)this_02);
    __fd = *in_RDI;
    fu2::abi_400::detail::
    function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(us_listen_socket_t_*)>_>
    ::
    function<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:308:46),_nullptr,_nullptr,_nullptr,_nullptr>
              ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(us_listen_socket_t_*)>_>
                *)in_stack_fffffffffffffcc0,
               (anon_class_8_1_8991fb9c_for_value_ *)in_stack_fffffffffffffcb8);
    uWS::TemplatedApp<false>::listen(this_01,__fd,(int)&stack0xfffffffffffffd48);
    uWS::TemplatedApp<false>::run((TemplatedApp<false> *)this_02);
    fu2::abi_400::detail::
    function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(us_listen_socket_t_*)>_>
    ::~function((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(us_listen_socket_t_*)>_>
                 *)0x214007);
  }
  std::unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>::
  ~unique_ptr(this_03);
  uWS::TemplatedApp<false>::WebSocketBehavior::~WebSocketBehavior(this_02);
  return;
}

Assistant:

void run() {
        mainLoop = uWS::Loop::get();

        {
            const char * kProtocol = SSL ? "HTTPS" : "HTTP";
            my_printf("[incppect] running instance. serving %s from '%s'\n", kProtocol, parameters.httpRoot.c_str());
        }

        typename uWS::TemplatedApp<SSL>::WebSocketBehavior wsBehaviour;
        wsBehaviour.compression = uWS::SHARED_COMPRESSOR;
        wsBehaviour.maxPayloadLength = parameters.maxPayloadLength_bytes;
        wsBehaviour.idleTimeout = parameters.tIdleTimeout_s;
        wsBehaviour.open = [&](auto * ws, auto * /*req*/) {
            static int32_t uniqueId = 1;
            ++uniqueId;

            auto & cd = clientData[uniqueId];
            cd.tConnected_ms = ::timestamp();

            auto addressBytes = ws->getRemoteAddress();
            cd.ipAddress[0] = addressBytes[12];
            cd.ipAddress[1] = addressBytes[13];
            cd.ipAddress[2] = addressBytes[14];
            cd.ipAddress[3] = addressBytes[15];

            auto sd = (PerSocketData *) ws->getUserData();
            sd->clientId = uniqueId;
            sd->ws = ws;
            sd->mainLoop = uWS::Loop::get();

            socketData.insert({ uniqueId, sd });

            my_printf("[incppect] client with id = %d connected\n", sd->clientId);

            if (handler) {
                handler(sd->clientId, Connect, { (const char *) cd.ipAddress, 4 } );
            }
        };
        wsBehaviour.message = [this](auto * ws, std::string_view message, uWS::OpCode /*opCode*/) {
            rxTotal_bytes += message.size();
            if (message.size() < sizeof(int)) {
                return;
            }

            int32_t type = -1;
            std::memcpy((char *)(&type), message.data(), sizeof(type));

            bool doUpdate = true;

            auto sd = (PerSocketData *) ws->getUserData();
            auto & cd = clientData[sd->clientId];

            switch (type) {
                case 1:
                    {
                        std::stringstream ss(message.data() + 4);
                        while (true) {
                            Request request;

                            std::string path;
                            ss >> path;
                            if (ss.eof()) break;
                            int requestId = 0;
                            ss >> requestId;
                            int nidxs = 0;
                            ss >> nidxs;
                            for (int i = 0; i < nidxs; ++i) {
                                int idx = 0;
                                ss >> idx;
                                if (idx == -1) idx = sd->clientId;
                                request.idxs.push_back(idx);
                            }

                            if (pathToGetter.find(path) != pathToGetter.end()) {
                                my_printf("[incppect] requestId = %d, path = '%s', nidxs = %d\n", requestId, path.c_str(), nidxs);
                                request.getterId = pathToGetter[path];

                                cd.requests[requestId] = std::move(request);
                            } else {
                                my_printf("[incppect] missing path '%s'\n", path.c_str());
                            }
                        }
                    }
                    break;
                case 2:
                    {
                        int nRequests = (message.size() - sizeof(int32_t))/sizeof(int32_t);
                        if (nRequests*sizeof(int32_t) + sizeof(int32_t) != message.size()) {
                            my_printf("[incppect] error : invalid message data!\n");
                            return;
                        }
                        my_printf("[incppect] received requests: %d\n", nRequests);

                        cd.lastRequests.clear();
                        for (int i = 0; i < nRequests; ++i) {
                            int32_t curRequest = -1;
                            std::memcpy((char *)(&curRequest), message.data() + 4*(i + 1), sizeof(curRequest));
                            if (cd.requests.find(curRequest) != cd.requests.end()) {
                                cd.lastRequests.push_back(curRequest);
                                cd.requests[curRequest].tLastRequested_ms = ::timestamp();
                                cd.requests[curRequest].tLastRequestTimeout_ms = parameters.tLastRequestTimeout_ms;
                            }
                        }
                    }
                    break;
                case 3:
                    {
                        for (auto curRequest : cd.lastRequests) {
                            if (cd.requests.find(curRequest) != cd.requests.end()) {
                                cd.requests[curRequest].tLastRequested_ms = ::timestamp();
                                cd.requests[curRequest].tLastRequestTimeout_ms = parameters.tLastRequestTimeout_ms;
                            }
                        }
                    }
                    break;
                case 4:
                    {
                        doUpdate = false;
                        if (handler && message.size() > sizeof(int32_t)) {
                            handler(sd->clientId, Custom, { message.data() + sizeof(int32_t), message.size() - sizeof(int32_t) } );
                        }
                    }
                    break;
                default:
                    my_printf("[incppect] unknown message type: %d\n", type);
            };

            if (doUpdate) {
                sd->mainLoop->defer([this]() { this->update(); });
            }
        };
        wsBehaviour.drain = [](auto *ws) {
            /* Check getBufferedAmount here */
            if (ws->getBufferedAmount() > 0) {
                my_printf("[incppect] drain: buffered amount = %d\n", ws->getBufferedAmount());
            }
        };
        wsBehaviour.ping = [](auto * /*ws*/) {

        };
        wsBehaviour.pong = [](auto * /*ws*/) {

        };
        wsBehaviour.close = [this](auto * ws, int /*code*/, std::string_view /*message*/) {
            auto sd = (PerSocketData *) ws->getUserData();
            my_printf("[incppect] client with id = %d disconnected\n", sd->clientId);

            clientData.erase(sd->clientId);
            socketData.erase(sd->clientId);

            if (handler) {
                handler(sd->clientId, Disconnect, { nullptr, 0 } );
            }
        };

        std::unique_ptr<uWS::TemplatedApp<SSL>> app;

        if constexpr (SSL) {
            us_socket_context_options_t ssl_options = {};

            ssl_options.key_file_name = parameters.sslKey.data();
            ssl_options.cert_file_name = parameters.sslCert.data();

            app.reset(new uWS::TemplatedApp<SSL>(ssl_options));
        } else {
            app.reset(new uWS::TemplatedApp<SSL>());
        }

        if (app->constructorFailed()) {
            my_printf("[incppect] failed to construct uWS server!\n");
            if (SSL) {
                my_printf("[incppect] verify that you have valid certificate files:\n");
                my_printf("[incppect] key  file : '%s'\n", parameters.sslKey.c_str());
                my_printf("[incppect] cert file : '%s'\n", parameters.sslCert.c_str());
            }

            return;
        }

        (*app).template ws<PerSocketData>("/incppect", std::move(wsBehaviour)
        ).get("/incppect.js", [](auto *res, auto * /*req*/) {
                res->end(kIncppect_js);
        });
        for (const auto & resource : parameters.resources) {
            (*app).get("/" + resource, [this](auto *res, auto *req) {
                std::string url = std::string(req->getUrl());
                my_printf("url = '%s'\n", url.c_str());

                if (url.size() == 0) {
                    res->end("Resource not found");
                    return;
                }

                if (url[url.size() - 1] == '/') {
                    url += "index.html";
                }

                if (resources.find(url) != resources.end()) {
                    res->end(resources[url]);
                    return;
                }

                my_printf("resource = '%s'\n", (parameters.httpRoot + url).c_str());
                std::ifstream fin(parameters.httpRoot + url);

                if (fin.is_open() == false || fin.good() == false) {
                    res->end("Resource not found");
                    return;
                }

                const std::string str((std::istreambuf_iterator<char>(fin)),
                                      std::istreambuf_iterator<char>());

                if (str.size() == 0) {
                    res->end("Resource not found");
                    return;
                }

                if (hasExt(req->getUrl(), ".js")) {
                    res->writeHeader("Content-Type", "text/javascript");
                }

                res->end(str);
            });
        }
        (*app).get("/*", [this](auto *res, auto *req) {
            const std::string url = std::string(req->getUrl());
            my_printf("url = '%s'\n", url.c_str());

            res->end("Resource not found");
            return;
        });
        (*app).listen(parameters.portListen, [this](auto *token) {
            this->listenSocket = token;
            if (token) {
                my_printf("[incppect] listening on port %d\n", parameters.portListen);

                const char * kProtocol = SSL ? "https" : "http";
                my_printf("[incppect] %s://localhost:%d/\n", kProtocol, parameters.portListen);
            }
        }).run();
    }